

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateRowIndexDelete(Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx)

{
  ushort uVar1;
  int in_ECX;
  Table *in_RSI;
  long in_RDI;
  long in_R8;
  Index *pPk;
  Vdbe *v;
  Index *pPrior;
  Index *pIdx;
  int iPartIdxLabel;
  int r1;
  int i;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Parse *pPVar2;
  Parse *pPVar3;
  Vdbe *p;
  Parse *pParse_00;
  Parse *local_38;
  Index *in_stack_ffffffffffffffd0;
  int regPrior;
  int iVar4;
  int local_24;
  
  regPrior = -1;
  pParse_00 = (Parse *)0x0;
  p = *(Vdbe **)(in_RDI + 0x10);
  if ((in_RSI->tabFlags & 0x20) == 0) {
    pPVar2 = (Parse *)0x0;
  }
  else {
    pPVar2 = (Parse *)sqlite3PrimaryKeyIndex(in_RSI);
  }
  local_24 = 0;
  pPVar3 = pPVar2;
  for (local_38 = (Parse *)in_RSI->pIndex; local_38 != (Parse *)0x0;
      local_38 = *(Parse **)(local_38->aTempReg + 1)) {
    if (((in_R8 == 0) || (*(int *)(in_R8 + (long)local_24 * 4) != 0)) && (local_38 != pPVar3)) {
      in_stack_ffffffffffffffa4 =
           sqlite3GenerateIndexKey
                     (pParse_00,(Index *)p,(int)((ulong)pPVar3 >> 0x20),(int)pPVar3,
                      (int)((ulong)pPVar2 >> 0x20),
                      (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffffd0,regPrior);
      in_stack_ffffffffffffffa0 = in_ECX + local_24;
      if ((*(byte *)((long)&local_38->nSet + 3) >> 3 & 1) == 0) {
        uVar1 = *(ushort *)&local_38->nSet;
      }
      else {
        uVar1 = *(u16 *)((long)&local_38->nMem + 2);
      }
      iVar4 = in_stack_ffffffffffffffa4;
      sqlite3VdbeAddOp3(p,(uint)uVar1,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff88);
      sqlite3ResolvePartIdxLabel
                ((Parse *)CONCAT44(in_stack_ffffffffffffff84,regPrior),
                 (int)((ulong)pParse_00 >> 0x20));
      pParse_00 = local_38;
      regPrior = iVar4;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx       /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
                                 &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
                      pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}